

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * __thiscall
CPP::WriteInitialization::noTrCall(WriteInitialization *this,DomString *str,QString *defaultString)

{
  bool bVar1;
  long in_RDX;
  long in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QTextStream ts;
  QString value;
  undefined4 in_stack_ffffffffffffff58;
  OpenModeFlag in_stack_ffffffffffffff5c;
  QTextStream *str_00;
  _string<true> local_60;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  str_00 = in_RDI;
  QString::QString((QString *)in_RDI,
                   (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if ((in_RDX == 0) && (bVar1 = QString::isEmpty((QString *)0x135238), bVar1)) {
    QString::QString((QString *)0x135248);
  }
  else {
    if (in_RDX != 0) {
      DomString::text((DomString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::operator=((QString *)str_00,
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x135288);
    }
    *(undefined8 *)str_00 = 0xaaaaaaaaaaaaaaaa;
    *(char16_t **)(str_00 + 8) = (char16_t *)0xaaaaaaaaaaaaaaaa;
    *(qsizetype *)(str_00 + 0x10) = -0x5555555555555556;
    QString::QString((QString *)0x1352b7);
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)str_00,in_stack_ffffffffffffff5c);
    QTextStream::QTextStream
              ((QTextStream *)&local_48,(QString *)str_00,(QFlags_conflict *)(ulong)local_4c);
    language::_string<true>::_string(&local_60,&local_20,(QString *)(in_RSI + 0x40));
    language::operator<<
              (str_00,(_string<true> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
              );
    QTextStream::~QTextStream((QTextStream *)&local_48);
  }
  QString::~QString((QString *)0x135352);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::noTrCall(DomString *str, const QString &defaultString) const
{
    QString value = defaultString;
    if (!str && defaultString.isEmpty())
        return {};
    if (str)
        value = str->text();
    QString ret;
    QTextStream ts(&ret);
    ts << language::qstring(value, m_dindent);
    return ret;
}